

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportModelDense(HModel *this)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  long in_RDI;
  int i_3;
  int i_2;
  int ind;
  int j;
  int i_1;
  int i;
  int colCostSz;
  char buff [16];
  int local_40;
  int local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  char local_18 [24];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"N=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x60c));
  poVar3 = std::operator<<(poVar3,",  M=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x610));
  poVar3 = std::operator<<(poVar3,",  NZ= ");
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                      (long)*(int *)(in_RDI + 0x60c));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
  std::operator<<(poVar3,'\n');
  if ((*(int *)(in_RDI + 0x60c) < 0xb) && (*(int *)(in_RDI + 0x610) < 0x65)) {
    std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690));
    for (local_20 = 0; local_20 < (int)sVar5; local_20 = local_20 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_20
                         );
      sprintf(local_18,"%2.1g ",*pvVar6);
      std::operator<<((ostream *)&std::cout,local_18);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"------A------\n");
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x610); local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x60c); local_28 = local_28 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_28);
        local_2c = *pvVar4;
        while( true ) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_2c);
          bVar1 = false;
          if (*pvVar4 != local_24) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                (long)(local_28 + 1));
            bVar1 = local_2c < *pvVar4;
          }
          if (!bVar1) break;
          local_2c = local_2c + 1;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_2c);
        if ((*pvVar4 == local_24) &&
           (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                (long)(local_28 + 1)), local_2c < *pvVar4)) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)local_2c);
          sprintf(local_18,"%2.1g ",*pvVar6);
          _Var2 = std::setw(5);
          poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
          std::operator<<(poVar3,local_18);
        }
        else {
          _Var2 = std::setw(5);
          poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
          std::operator<<(poVar3," ");
        }
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)&std::cout,"------LB------\n");
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x610); local_38 = local_38 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),(long)local_38
                         );
      if (*pvVar6 <= -1e+200) {
        sprintf(local_18,"-inf");
      }
      else {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                            (long)local_38);
        sprintf(local_18,"%2.1g ",*pvVar6);
      }
      _Var2 = std::setw(5);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
      std::operator<<(poVar3,local_18);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"------UB------\n");
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x610); local_40 = local_40 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),(long)local_40
                         );
      if (1e+200 < *pvVar6 || *pvVar6 == 1e+200) {
        sprintf(local_18,"inf");
      }
      else {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                            (long)local_40);
        sprintf(local_18,"%2.1g ",*pvVar6);
      }
      _Var2 = std::setw(5);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
      std::operator<<(poVar3,local_18);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void HModel::util_reportModelDense() {
  cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';	
  if (numCol>10 || numRow>100) return;
  cout<<"\n-----cost-----\n";
  
  char buff [16];
  int colCostSz = colCost.size();
  for (int i=0; i<colCostSz; i++) { 
    sprintf(buff, "%2.1g ", colCost[i]);
    cout<<buff; 
  }
  cout<<endl;
  cout<<"------A------\n";
  for (int i=0;i<numRow;i++) {
    for (int j=0;j<numCol;j++) {
      
      int ind = Astart[j];
      while (Aindex[ind]!=i && ind<Astart[j+1]) 
	ind++;
      
      
      //if a_ij is nonzero print
      if (Aindex[ind]==i && ind<Astart[j+1])
	{	
	  sprintf(buff, "%2.1g ", Avalue[ind]);
	  cout<<setw(5)<<buff;
	}
      else cout<<setw(5)<<" ";
      
    }
    cout<<endl;
  }
  cout<<"------LB------\n";
  for (int i=0;i<numRow;i++) { 	
    if (rowLower[i]>-HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowLower[i]);
    else 
      sprintf(buff, "-inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
  cout<<"------UB------\n";
  for (int i=0;i<numRow;i++) { 
    if (rowUpper[i]<HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowUpper[i]);
    else 
      sprintf(buff, "inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
}